

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask19_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x13 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xd;
  *puVar1 = in[2] << 6 | *puVar1;
  *puVar1 = in[3] << 0x19 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 7;
  *puVar1 = in[4] << 0xc | *puVar1;
  *puVar1 = in[5] << 0x1f | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] >> 1;
  *puVar1 = in[6] << 0x12 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] >> 0xe;
  *puVar1 = in[7] << 5 | *puVar1;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask19_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}